

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_search_path.cpp
# Opt level: O3

string * duckdb::CatalogSearchEntry::WriteOptionallyQuoted
                   (string *__return_storage_ptr__,string *input)

{
  pointer pcVar1;
  size_type sVar2;
  long lVar3;
  long *plVar4;
  size_type sVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  pcVar1 = (input->_M_dataplus)._M_p;
  sVar2 = input->_M_string_length;
  if (sVar2 != 0) {
    sVar5 = 0;
    do {
      if ((byte)(pcVar1[sVar5] | 2U) == 0x2e) {
        ::std::operator+(&local_38,"\"",input);
        plVar4 = (long *)::std::__cxx11::string::append((char *)&local_38);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar6) {
          lVar3 = plVar4[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
        }
        __return_storage_ptr__->_M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p == &local_38.field_2) {
          return __return_storage_ptr__;
        }
        operator_delete(local_38._M_dataplus._M_p);
        return __return_storage_ptr__;
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

string CatalogSearchEntry::WriteOptionallyQuoted(const string &input) {
	for (idx_t i = 0; i < input.size(); i++) {
		if (input[i] == '.' || input[i] == ',') {
			return "\"" + input + "\"";
		}
	}
	return input;
}